

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

SXML_CHAR * str_unescape(SXML_CHAR *str)

{
  int iVar1;
  SXML_CHAR *pSVar2;
  
  iVar1 = 0;
  pSVar2 = str;
  if (str == (SXML_CHAR *)0x0) {
    return (SXML_CHAR *)0x0;
  }
  do {
    if (str[iVar1] == '\\') {
      iVar1 = iVar1 + 1;
    }
    else if (str[iVar1] == '\0') {
      return str;
    }
    *pSVar2 = str[iVar1];
    iVar1 = iVar1 + 1;
    pSVar2 = pSVar2 + 1;
  } while( true );
}

Assistant:

SXML_CHAR* str_unescape(SXML_CHAR* str)
{
	int i, j;

	if (str == NULL)
		return NULL;

	for (i = j = 0; str[j]; j++) {
		if (str[j] == C2SX('\\'))
			j++;
		str[i++] = str[j];
	}

	return str;
}